

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
ArgsManager::GetUnsuitableSectionOnlyArgs_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,ArgsManager *this)

{
  _Rb_tree_header *p_Var1;
  size_t __n;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  *p_Var2;
  _Alloc_hider _Var3;
  int iVar4;
  _Base_ptr p_Var5;
  _Rb_tree_color _Var6;
  _Base_ptr p_Var7;
  long in_FS_OFFSET;
  bool bVar8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unsuitables;
  unique_lock<std::recursive_mutex> local_98;
  string local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_owns = false;
  local_98._M_device = (mutex_type *)this;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  std::unique_lock<std::recursive_mutex>::lock(&local_98);
  if ((this->m_network)._M_string_length != 0) {
    ChainTypeToString_abi_cxx11_(&local_88,MAIN);
    _Var3._M_p = local_88._M_dataplus._M_p;
    __n = (this->m_network)._M_string_length;
    if (__n == local_88._M_string_length) {
      if (__n == 0) {
        bVar8 = true;
      }
      else {
        iVar4 = bcmp((this->m_network)._M_dataplus._M_p,local_88._M_dataplus._M_p,__n);
        bVar8 = iVar4 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != &local_88.field_2) {
      operator_delete(_Var3._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (!bVar8) {
      p_Var5 = (this->m_network_only_args)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->m_network_only_args)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var5 != p_Var1) {
        do {
          SettingName(&local_88,(string *)(p_Var5 + 1));
          bVar8 = common::OnlyHasDefaultSectionSetting(&this->m_settings,&this->m_network,&local_88)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if (bVar8) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var5 + 1));
          }
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
        } while ((_Rb_tree_header *)p_Var5 != p_Var1);
      }
      p_Var5 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
      if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        p_Var2 = &(__return_storage_ptr__->_M_t)._M_impl;
        _Var6 = _S_red;
        p_Var7 = p_Var5;
      }
      else {
        p_Var2 = &local_68._M_impl;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
        (local_68._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var5;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
             local_68._M_impl.super__Rb_tree_header._M_node_count;
        local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        p_Var1 = &local_68._M_impl.super__Rb_tree_header;
        p_Var5 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var7 = local_68._M_impl.super__Rb_tree_header._M_header._M_right;
        _Var6 = local_68._M_impl.super__Rb_tree_header._M_header._M_color;
        local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      }
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = p_Var5;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = p_Var7;
      (p_Var2->super__Rb_tree_header)._M_node_count = 0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _Var6;
      goto LAB_00d3d395;
    }
  }
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
LAB_00d3d395:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_98);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::set<std::string> ArgsManager::GetUnsuitableSectionOnlyArgs() const
{
    std::set<std::string> unsuitables;

    LOCK(cs_args);

    // if there's no section selected, don't worry
    if (m_network.empty()) return std::set<std::string> {};

    // if it's okay to use the default section for this network, don't worry
    if (m_network == ChainTypeToString(ChainType::MAIN)) return std::set<std::string> {};

    for (const auto& arg : m_network_only_args) {
        if (OnlyHasDefaultSectionSetting(m_settings, m_network, SettingName(arg))) {
            unsuitables.insert(arg);
        }
    }
    return unsuitables;
}